

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O3

ktx_error_code_e
ktxTexture1_Create(ktxTextureCreateInfo *createInfo,ktxTextureCreateStorageEnum storageAllocation,
                  ktxTexture1 **newTex)

{
  ktxTexture_protected *pkVar1;
  PFNCALCFACELODSIZE p_Var2;
  ktx_error_code_e kVar3;
  uint uVar4;
  ktxTexture1 *This;
  ktxTexture1_private *pkVar5;
  ktx_size_t __size;
  ktx_uint8_t *pkVar6;
  ulong uVar7;
  ktx_uint32_t kVar8;
  GLenum GVar9;
  ktxFormatSize local_50;
  
  if (newTex == (ktxTexture1 **)0x0) {
    return KTX_INVALID_VALUE;
  }
  This = (ktxTexture1 *)calloc(1,0x90);
  if (This == (ktxTexture1 *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  GVar9 = createInfo->glInternalformat;
  This->glInternalformat = GVar9;
  glGetFormatSize(GVar9,&local_50);
  if (local_50.blockSizeInBits == 0) {
    kVar3 = KTX_UNSUPPORTED_TEXTURE_TYPE;
    goto switchD_001dc505_caseD_93be;
  }
  kVar8 = 0x1903;
  kVar3 = KTX_INVALID_VALUE;
  if ((int)GVar9 < 0x8d70) {
    if ((int)GVar9 < 0x8814) {
      if (0x8228 < (int)GVar9) {
        switch(GVar9) {
        case 0x8229:
        case 0x822a:
        case 0x822d:
        case 0x822e:
        case 0x8231:
        case 0x8232:
        case 0x8233:
        case 0x8234:
        case 0x8235:
        case 0x8236:
          goto switchD_001dc5a9_caseD_9270;
        case 0x822b:
        case 0x822c:
        case 0x822f:
        case 0x8230:
        case 0x8237:
        case 0x8238:
        case 0x8239:
        case 0x823a:
        case 0x823b:
        case 0x823c:
          goto switchD_001dc5a9_caseD_9272;
        default:
          switch(GVar9) {
          case 0x83f0:
            goto switchD_001dc5a9_caseD_9274;
          case 0x83f1:
          case 0x83f2:
          case 0x83f3:
            break;
          default:
            if (GVar9 != 0x87ee) goto switchD_001dc505_caseD_93be;
          }
          goto switchD_001dc505_caseD_93b0;
        }
      }
      if ((int)GVar9 < 0x81a5) {
        switch(GVar9) {
        case 0x804f:
        case 0x8050:
        case 0x8051:
        case 0x8052:
        case 0x8053:
        case 0x8054:
          break;
        case 0x8055:
        case 0x8056:
        case 0x8057:
        case 0x8058:
        case 0x8059:
        case 0x805a:
        case 0x805b:
          goto switchD_001dc505_caseD_93b0;
        default:
          if (GVar9 != 0x2a10) goto switchD_001dc505_caseD_93be;
        }
        goto switchD_001dc5a9_caseD_9274;
      }
      if (((GVar9 != 0x81a5) && (GVar9 != 0x81a6)) && (GVar9 != 0x81a7))
      goto switchD_001dc505_caseD_93be;
LAB_001dcc83:
      kVar8 = 0x1902;
      goto switchD_001dc5a9_caseD_9270;
    }
    if (0x8c39 < (int)GVar9) {
      if ((int)GVar9 < 0x8c73) {
        if ((int)GVar9 < 0x8c4c) {
          switch(GVar9) {
          case 0x8c3a:
          case 0x8c3d:
          case 0x8c41:
            goto switchD_001dc5a9_caseD_9274;
          default:
            goto switchD_001dc505_caseD_93be;
          case 0x8c43:
            goto switchD_001dc505_caseD_93b0;
          }
        }
        switch(GVar9) {
        case 0x8c4c:
          goto switchD_001dc5a9_caseD_9274;
        case 0x8c4d:
        case 0x8c4e:
        case 0x8c4f:
          goto switchD_001dc505_caseD_93b0;
        default:
          if (1 < GVar9 - 0x8c70) {
            if (GVar9 != 0x8c72) goto switchD_001dc505_caseD_93be;
            goto switchD_001dc5a9_caseD_9272;
          }
          goto switchD_001dc5a9_caseD_9270;
        }
      }
      if ((int)GVar9 < 0x8d46) {
        if (0x8c92 < (int)GVar9) {
          if (GVar9 != 0x8c93) {
            if (GVar9 != 0x8cac) {
              if (GVar9 != 0x8cad) goto switchD_001dc505_caseD_93be;
              goto LAB_001dcc6c;
            }
            goto LAB_001dcc83;
          }
          goto switchD_001dc505_caseD_93b0;
        }
        if (GVar9 == 0x8c73) goto switchD_001dc5a9_caseD_9272;
        if (GVar9 != 0x8c92) goto switchD_001dc505_caseD_93be;
      }
      else {
        switch(GVar9) {
        case 0x8d46:
        case 0x8d47:
        case 0x8d48:
        case 0x8d49:
          kVar8 = 0x1901;
          goto switchD_001dc5a9_caseD_9270;
        default:
          if ((GVar9 != 0x8d62) && (GVar9 != 0x8d64)) goto switchD_001dc505_caseD_93be;
        }
      }
      goto switchD_001dc5a9_caseD_9274;
    }
    if (0x8b8f < (int)GVar9) {
      switch(GVar9) {
      case 0x8b90:
      case 0x8b92:
      case 0x8b95:
      case 0x8b97:
        goto switchD_001dc5a9_caseD_9274;
      case 0x8b91:
      case 0x8b93:
      case 0x8b94:
      case 0x8b96:
      case 0x8b98:
      case 0x8b99:
        goto switchD_001dc505_caseD_93b0;
      default:
        switch(GVar9) {
        case 0x8c00:
        case 0x8c01:
          goto switchD_001dc5a9_caseD_9274;
        case 0x8c02:
        case 0x8c03:
          goto switchD_001dc505_caseD_93b0;
        default:
          goto switchD_001dc505_caseD_93be;
        }
      }
    }
    switch(GVar9) {
    case 0x8814:
    case 0x881a:
      goto switchD_001dc505_caseD_93b0;
    case 0x8815:
    case 0x881b:
      goto switchD_001dc5a9_caseD_9274;
    case 0x8816:
    case 0x8817:
    case 0x8818:
    case 0x8819:
      goto switchD_001dc505_caseD_93be;
    default:
      switch(GVar9) {
      case 0x8a54:
      case 0x8a55:
        goto switchD_001dc5a9_caseD_9274;
      case 0x8a56:
      case 0x8a57:
        goto switchD_001dc505_caseD_93b0;
      default:
        if (GVar9 != 0x88f0) goto switchD_001dc505_caseD_93be;
LAB_001dcc6c:
        kVar8 = 0x84f9;
        goto switchD_001dc5a9_caseD_9270;
      }
    }
  }
  if (0x93af < (int)GVar9) {
    switch(GVar9) {
    case 0x93b0:
    case 0x93b1:
    case 0x93b2:
    case 0x93b3:
    case 0x93b4:
    case 0x93b5:
    case 0x93b6:
    case 0x93b7:
    case 0x93b8:
    case 0x93b9:
    case 0x93ba:
    case 0x93bb:
    case 0x93bc:
    case 0x93bd:
    case 0x93c0:
    case 0x93c1:
    case 0x93c2:
    case 0x93c3:
    case 0x93c4:
    case 0x93c5:
    case 0x93c6:
    case 0x93c7:
    case 0x93c8:
    case 0x93c9:
    case 0x93d0:
    case 0x93d1:
    case 0x93d2:
    case 0x93d3:
    case 0x93d4:
    case 0x93d5:
    case 0x93d6:
    case 0x93d7:
    case 0x93d8:
    case 0x93d9:
    case 0x93da:
    case 0x93db:
    case 0x93dc:
    case 0x93dd:
    case 0x93e0:
    case 0x93e1:
    case 0x93e2:
    case 0x93e3:
    case 0x93e4:
    case 0x93e5:
    case 0x93e6:
    case 0x93e7:
    case 0x93e8:
    case 0x93e9:
    case 0x93f0:
    case 0x93f1:
      goto switchD_001dc505_caseD_93b0;
    default:
      goto switchD_001dc505_caseD_93be;
    }
  }
  if ((int)GVar9 < 0x8f94) {
    if (0x8dab < (int)GVar9) {
      if ((int)GVar9 < 0x8dbe) {
        if (GVar9 - 0x8dbb < 2) goto switchD_001dc5a9_caseD_9270;
        if (GVar9 == 0x8dac) goto LAB_001dcc6c;
        if (GVar9 != 0x8dbd) goto switchD_001dc505_caseD_93be;
      }
      else {
        switch(GVar9) {
        case 0x8e8c:
        case 0x8e8d:
          goto switchD_001dc505_caseD_93b0;
        case 0x8e8e:
        case 0x8e8f:
          goto switchD_001dc5a9_caseD_9274;
        default:
          if (GVar9 != 0x8dbe) goto switchD_001dc505_caseD_93be;
        }
      }
      goto switchD_001dc5a9_caseD_9272;
    }
    switch(GVar9) {
    case 0x8d70:
    case 0x8d76:
    case 0x8d7c:
    case 0x8d82:
switchD_001dc505_caseD_93b0:
      kVar8 = 0x1908;
      break;
    case 0x8d71:
    case 0x8d77:
    case 0x8d7d:
    case 0x8d83:
switchD_001dc5a9_caseD_9274:
      kVar8 = 0x1907;
      break;
    case 0x8d72:
    case 0x8d73:
    case 0x8d74:
    case 0x8d75:
    case 0x8d78:
    case 0x8d79:
    case 0x8d7a:
    case 0x8d7b:
    case 0x8d7e:
    case 0x8d7f:
    case 0x8d80:
    case 0x8d81:
      goto switchD_001dc505_caseD_93be;
    default:
      switch(GVar9) {
      case 0x8d88:
      case 0x8d8e:
        goto switchD_001dc505_caseD_93b0;
      case 0x8d89:
      case 0x8d8f:
        goto switchD_001dc5a9_caseD_9274;
      case 0x8d8a:
      case 0x8d8b:
      case 0x8d8c:
      case 0x8d8d:
        goto switchD_001dc505_caseD_93be;
      default:
        if (GVar9 != 0x8dab) goto switchD_001dc505_caseD_93be;
        goto LAB_001dcc83;
      }
    }
  }
  else {
    if (0x9136 < (int)GVar9) {
      switch(GVar9) {
      case 0x9270:
      case 0x9271:
        goto switchD_001dc5a9_caseD_9270;
      case 0x9272:
      case 0x9273:
        goto switchD_001dc5a9_caseD_9272;
      case 0x9274:
      case 0x9275:
        goto switchD_001dc5a9_caseD_9274;
      case 0x9276:
      case 0x9277:
      case 0x9278:
      case 0x9279:
        break;
      default:
        if ((GVar9 != 0x9137) && (GVar9 != 0x9138)) goto switchD_001dc505_caseD_93be;
      }
      goto switchD_001dc505_caseD_93b0;
    }
    if ((int)GVar9 < 0x8fbd) {
      switch(GVar9) {
      case 0x8f94:
      case 0x8f98:
        break;
      case 0x8f95:
      case 0x8f99:
switchD_001dc5a9_caseD_9272:
        kVar8 = 0x8227;
        break;
      case 0x8f96:
      case 0x8f9a:
        goto switchD_001dc5a9_caseD_9274;
      case 0x8f97:
      case 0x8f9b:
        goto switchD_001dc505_caseD_93b0;
      default:
        goto switchD_001dc505_caseD_93be;
      }
    }
    else if (GVar9 != 0x8fbd) {
      if (GVar9 != 0x8fbe) {
        if (GVar9 != 0x906f) goto switchD_001dc505_caseD_93be;
        goto switchD_001dc505_caseD_93b0;
      }
      goto switchD_001dc5a9_caseD_9272;
    }
  }
switchD_001dc5a9_caseD_9270:
  kVar3 = ktxTexture_construct((ktxTexture *)This,createInfo,&local_50);
  if (kVar3 != KTX_SUCCESS) goto switchD_001dc505_caseD_93be;
  This->classId = ktxTexture1_c;
  This->vtbl = &ktxTexture1_vtbl;
  p_Var2 = ktxTexture1_vtblInt.calcFaceLodSize;
  pkVar1 = This->_protected;
  (pkVar1->_vtbl).calcDataSizeLevels = ktxTexture1_vtblInt.calcDataSizeLevels;
  (pkVar1->_vtbl).calcFaceLodSize = p_Var2;
  (pkVar1->_vtbl).calcLevelOffset = ktxTexture1_vtblInt.calcLevelOffset;
  pkVar5 = (ktxTexture1_private *)malloc(1);
  This->_private = pkVar5;
  if (pkVar5 == (ktxTexture1_private *)0x0) {
    kVar3 = KTX_OUT_OF_MEMORY;
    goto switchD_001dc505_caseD_93be;
  }
  pkVar5->_needSwap = false;
  pkVar1 = This->_protected;
  This->isCompressed = SUB41((local_50.flags & 2) >> 1,0);
  if ((local_50.flags & 2) == 0) {
    This->glFormat = kVar8;
    This->glBaseInternalformat = kVar8;
    kVar8 = createInfo->glInternalformat;
    GVar9 = 0x1401;
    if (0x8d87 < (int)kVar8) {
      if (0x93af < (int)kVar8) {
        switch(kVar8) {
        case 0x93b0:
        case 0x93b1:
        case 0x93b2:
        case 0x93b3:
        case 0x93b4:
        case 0x93b5:
        case 0x93b6:
        case 0x93b7:
        case 0x93b8:
        case 0x93b9:
        case 0x93ba:
        case 0x93bb:
        case 0x93bc:
        case 0x93bd:
        case 0x93c0:
        case 0x93c1:
        case 0x93c2:
        case 0x93c3:
        case 0x93c4:
        case 0x93c5:
        case 0x93c6:
        case 0x93c7:
        case 0x93c8:
        case 0x93c9:
        case 0x93d0:
        case 0x93d1:
        case 0x93d2:
        case 0x93d3:
        case 0x93d4:
        case 0x93d5:
        case 0x93d6:
        case 0x93d7:
        case 0x93d8:
        case 0x93d9:
        case 0x93da:
        case 0x93db:
        case 0x93dc:
        case 0x93dd:
        case 0x93e0:
        case 0x93e1:
        case 0x93e2:
        case 0x93e3:
        case 0x93e4:
        case 0x93e5:
        case 0x93e6:
        case 0x93e7:
        case 0x93e8:
        case 0x93e9:
        case 0x93f0:
        case 0x93f1:
          goto switchD_001dca07_caseD_8d7c;
        default:
          goto switchD_001dca07_caseD_8d72;
        }
      }
      if (0x8fbc < (int)kVar8) {
        if ((int)kVar8 < 0x9270) {
          if ((1 < kVar8 - 0x8fbd) && (1 < kVar8 - 0x9137)) {
            if (kVar8 == 0x906f) goto switchD_001dcba5_caseD_8059;
            goto switchD_001dca07_caseD_8d72;
          }
        }
        else if (9 < kVar8 - 0x9270) goto switchD_001dca07_caseD_8d72;
        goto switchD_001dca07_caseD_8d7c;
      }
      if (0x8e8d < (int)kVar8) {
        switch(kVar8) {
        case 0x8f94:
        case 0x8f95:
        case 0x8f96:
        case 0x8f97:
switchD_001dcae1_caseD_8231:
          GVar9 = 0x1400;
          break;
        case 0x8f98:
        case 0x8f99:
        case 0x8f9a:
        case 0x8f9b:
switchD_001dcae1_caseD_8233:
          GVar9 = 0x1402;
          break;
        default:
          if ((kVar8 == 0x8e8e) || (kVar8 == 0x8e8f)) goto switchD_001dcae1_caseD_822e;
          goto switchD_001dca07_caseD_8d72;
        }
        goto switchD_001dca07_caseD_8d7c;
      }
      if ((int)kVar8 < 0x8dbb) {
        switch(kVar8) {
        case 0x8d88:
        case 0x8d89:
          goto switchD_001dcae1_caseD_8233;
        case 0x8d8a:
        case 0x8d8b:
        case 0x8d8c:
        case 0x8d8d:
          break;
        case 0x8d8e:
        case 0x8d8f:
          goto switchD_001dcae1_caseD_8231;
        default:
          if (kVar8 == 0x8dab) goto switchD_001dcae1_caseD_822e;
          if (kVar8 == 0x8dac) goto LAB_001dcde3;
        }
      }
      else if ((kVar8 - 0x8dbb < 4) || (kVar8 - 0x8e8c < 2)) goto switchD_001dca07_caseD_8d7c;
      goto switchD_001dca07_caseD_8d72;
    }
    if (0x8a53 < (int)kVar8) {
      if ((int)kVar8 < 0x8c4c) {
        if ((int)kVar8 < 0x8c00) {
          switch(kVar8) {
          case 0x8b90:
          case 0x8b91:
          case 0x8b95:
          case 0x8b96:
            break;
          case 0x8b92:
          case 0x8b97:
switchD_001dcb7b_caseD_8b92:
            GVar9 = 0x8363;
            break;
          case 0x8b93:
          case 0x8b98:
            goto switchD_001dcb7b_caseD_8b93;
          case 0x8b94:
          case 0x8b99:
            goto switchD_001dcb7b_caseD_8b94;
          default:
            uVar4 = kVar8 - 0x8a54;
LAB_001dcd80:
            if (3 < uVar4) goto switchD_001dca07_caseD_8d72;
          }
        }
        else if (3 < kVar8 - 0x8c00) {
          switch(kVar8) {
          case 0x8c3a:
            GVar9 = 0x8c3b;
            break;
          default:
            goto switchD_001dca07_caseD_8d72;
          case 0x8c3d:
            GVar9 = 0x8c3e;
            break;
          case 0x8c41:
          case 0x8c43:
            break;
          }
        }
      }
      else if ((int)kVar8 < 0x8d46) {
        uVar7 = (ulong)(kVar8 - 0x8c70);
        if (0x3d < kVar8 - 0x8c70) {
LAB_001dcc02:
          uVar4 = kVar8 - 0x8c4c;
          goto LAB_001dcd80;
        }
        if ((0xc0000000fU >> (uVar7 & 0x3f) & 1) == 0) {
          if (uVar7 == 0x3c) goto switchD_001dcae1_caseD_822e;
          if (uVar7 != 0x3d) goto LAB_001dcc02;
LAB_001dcde3:
          GVar9 = 0x8dad;
        }
      }
      else if ((int)kVar8 < 0x8d64) {
        if (2 < kVar8 - 0x8d46) {
          if (kVar8 != 0x8d49) {
            if (kVar8 == 0x8d62) goto switchD_001dcb7b_caseD_8b92;
            goto switchD_001dca07_caseD_8d72;
          }
          goto switchD_001dca07_caseD_8d76;
        }
      }
      else {
        switch(kVar8) {
        case 0x8d70:
        case 0x8d71:
          goto switchD_001dca07_caseD_8d70;
        case 0x8d72:
        case 0x8d73:
        case 0x8d74:
        case 0x8d75:
        case 0x8d78:
        case 0x8d79:
        case 0x8d7a:
        case 0x8d7b:
        case 0x8d7e:
        case 0x8d7f:
        case 0x8d80:
        case 0x8d81:
          goto switchD_001dca07_caseD_8d72;
        case 0x8d76:
        case 0x8d77:
          goto switchD_001dca07_caseD_8d76;
        case 0x8d7c:
        case 0x8d7d:
          break;
        case 0x8d82:
        case 0x8d83:
          goto switchD_001dca07_caseD_8d82;
        default:
          if (kVar8 != 0x8d64) goto switchD_001dca07_caseD_8d72;
        }
      }
      goto switchD_001dca07_caseD_8d7c;
    }
    if ((int)kVar8 < 0x8229) {
      if ((int)kVar8 < 0x81a5) {
        switch(kVar8) {
        case 0x804f:
        case 0x8056:
switchD_001dcb7b_caseD_8b93:
          GVar9 = 0x8033;
          break;
        case 0x8050:
        case 0x8057:
switchD_001dcb7b_caseD_8b94:
          GVar9 = 0x8034;
          break;
        case 0x8051:
        case 0x8055:
        case 0x8058:
          break;
        case 0x8052:
          GVar9 = 0x8036;
          break;
        case 0x8053:
        case 0x8054:
        case 0x805a:
        case 0x805b:
switchD_001dca07_caseD_8d76:
          GVar9 = 0x1403;
          break;
        case 0x8059:
switchD_001dcba5_caseD_8059:
          GVar9 = 0x8368;
          break;
        default:
          if (kVar8 != 0x2a10) goto switchD_001dca07_caseD_8d72;
          GVar9 = 0x8362;
        }
      }
      else {
        if (kVar8 == 0x81a5) goto switchD_001dca07_caseD_8d76;
        if (kVar8 != 0x81a6) {
          if (kVar8 == 0x81a7) goto switchD_001dca07_caseD_8d70;
          goto switchD_001dca07_caseD_8d72;
        }
LAB_001dce0f:
        GVar9 = 0x84fa;
      }
      goto switchD_001dca07_caseD_8d7c;
    }
    if ((int)kVar8 < 0x83f0) {
      switch(kVar8) {
      case 0x8229:
      case 0x822b:
      case 0x8232:
      case 0x8238:
        break;
      case 0x822a:
      case 0x822c:
      case 0x8234:
      case 0x823a:
        goto switchD_001dca07_caseD_8d76;
      case 0x822d:
      case 0x822f:
switchD_001dcae1_caseD_822d:
        GVar9 = 0x140b;
        break;
      case 0x822e:
      case 0x8230:
switchD_001dcae1_caseD_822e:
        GVar9 = 0x1406;
        break;
      case 0x8231:
      case 0x8237:
        goto switchD_001dcae1_caseD_8231;
      case 0x8233:
      case 0x8239:
        goto switchD_001dcae1_caseD_8233;
      case 0x8235:
      case 0x823b:
switchD_001dca07_caseD_8d82:
        GVar9 = 0x1404;
        break;
      case 0x8236:
      case 0x823c:
switchD_001dca07_caseD_8d70:
        GVar9 = 0x1405;
        break;
      default:
        goto switchD_001dca07_caseD_8d72;
      }
switchD_001dca07_caseD_8d7c:
      This->glType = GVar9;
      uVar4 = glGetTypeSizeFromType(GVar9);
      if ((uVar4 < 5) && ((0x16U >> (uVar4 & 0x1f) & 1) != 0)) goto LAB_001dca73;
      kVar3 = KTX_INVALID_VALUE;
      if (uVar4 == 0x501) {
        __assert_fail("typeSize != GL_INVALID_VALUE",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture1.c"
                      ,0x6f,
                      "ktx_error_code_e ktxTexture1_construct(ktxTexture1 *, const ktxTextureCreateInfo *const, ktxTextureCreateStorageEnum)"
                     );
      }
    }
    else {
      if ((int)kVar8 < 0x8814) {
        if ((kVar8 - 0x83f0 < 4) || (kVar8 == 0x87ee)) goto switchD_001dca07_caseD_8d7c;
      }
      else {
        switch(kVar8) {
        case 0x8814:
        case 0x8815:
          goto switchD_001dcae1_caseD_822e;
        case 0x8816:
        case 0x8817:
        case 0x8818:
        case 0x8819:
          break;
        case 0x881a:
        case 0x881b:
          goto switchD_001dcae1_caseD_822d;
        default:
          if (kVar8 == 0x88f0) goto LAB_001dce0f;
        }
      }
switchD_001dca07_caseD_8d72:
      This->glType = 0x501;
      kVar3 = KTX_INVALID_VALUE;
    }
  }
  else {
    This->glFormat = 0;
    This->glBaseInternalformat = kVar8;
    This->glType = 0;
    uVar4 = 1;
LAB_001dca73:
    pkVar1->_typeSize = uVar4;
    if (storageAllocation != KTX_TEXTURE_CREATE_ALLOC_STORAGE) {
LAB_001dca9c:
      *newTex = This;
      return KTX_SUCCESS;
    }
    __size = ktxTexture_calcDataSizeTexture((ktxTexture *)This);
    This->dataSize = __size;
    pkVar6 = (ktx_uint8_t *)malloc(__size);
    This->pData = pkVar6;
    if (pkVar6 != (ktx_uint8_t *)0x0) goto LAB_001dca9c;
    kVar3 = KTX_OUT_OF_MEMORY;
  }
  ktxTexture1_destruct(This);
  ktxTexture_destruct((ktxTexture *)This);
switchD_001dc505_caseD_93be:
  free(This);
  return kVar3;
}

Assistant:

KTX_error_code
ktxTexture1_Create(const ktxTextureCreateInfo* const createInfo,
                   ktxTextureCreateStorageEnum storageAllocation,
                   ktxTexture1** newTex)
{
    KTX_error_code result;

    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture1* tex = (ktxTexture1*)malloc(sizeof(ktxTexture1));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture1_construct(tex, createInfo, storageAllocation);
    if (result != KTX_SUCCESS) {
        free(tex);
    } else {
        *newTex = tex;
    }
    return result;
}